

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

FieldSubset * __thiscall
capnp::StructSchema::getNonUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  byte *pbVar3;
  StructDataBitCount SVar4;
  ushort uVar5;
  Reader fields;
  ListReader local_78;
  PointerReader local_48;
  
  local_48.pointer = (WirePointer *)((this->super_Schema).raw)->generic->encodedNode;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  capnp::_::PointerReader::getStruct((StructReader *)&local_78,&local_48,(word *)0x0);
  SVar4 = local_78.structDataSize;
  pbVar3 = local_78.ptr;
  local_48.pointer = (WirePointer *)0x0;
  local_48.segment = (SegmentReader *)0x0;
  local_48.capTable = (CapTableReader *)0x0;
  local_48.nestingLimit = 0x7fffffff;
  if (3 < local_78.structPointerCount) {
    local_48.pointer = (WirePointer *)(CONCAT44(local_78.step,local_78.elementCount) + 0x18);
    local_48.segment = local_78.segment;
    local_48.capTable = local_78.capTable;
    local_48.nestingLimit = local_78.nestingLimit;
  }
  uVar5 = 0;
  capnp::_::PointerReader::getList(&local_78,&local_48,INLINE_COMPOSITE,(word *)0x0);
  if (0xff < SVar4) {
    uVar5 = *(ushort *)(pbVar3 + 0x1e);
  }
  pRVar1 = (this->super_Schema).raw;
  (__return_storage_ptr__->list).reader.structDataSize = local_78.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_78.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_78.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_78._39_1_;
  *(ulong *)&(__return_storage_ptr__->list).reader.nestingLimit =
       CONCAT44(local_78._44_4_,local_78.nestingLimit);
  (__return_storage_ptr__->list).reader.ptr = local_78.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_78.elementCount;
  (__return_storage_ptr__->list).reader.step = local_78.step;
  (__return_storage_ptr__->list).reader.segment = local_78.segment;
  (__return_storage_ptr__->list).reader.capTable = local_78.capTable;
  puVar2 = pRVar1->generic->membersByDiscriminant;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = (uint16_t *)((ulong)((uint)uVar5 + (uint)uVar5) + (long)puVar2);
  __return_storage_ptr__->size_ = local_78.elementCount - uVar5;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getNonUnionFields() const {
  auto proto = getProto().getStruct();
  auto fields = proto.getFields();
  auto offset = proto.getDiscriminantCount();
  auto size = fields.size() - offset;
  return FieldSubset(*this, fields, raw->generic->membersByDiscriminant + offset, size);
}